

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseTriangle(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte *pbVar1;
  byte bVar2;
  void *pvVar3;
  pointer pFVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  byte *apbStack_118 [5];
  undefined1 local_f0 [200];
  
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
  lVar6 = 0x30;
  do {
    *(undefined8 *)((long)apbStack_118 + lVar6 + 0x10) = 0;
    *(undefined8 *)((long)apbStack_118 + lVar6 + 0x18) = 0;
    *(undefined8 *)((long)apbStack_118 + lVar6) = 0;
    *(undefined8 *)((long)apbStack_118 + lVar6 + 8) = 0;
    *(undefined8 *)((long)apbStack_118 + lVar6 + 0x20) = 0xffffffff00000000;
    *(undefined8 *)(local_f0 + lVar6) = 0;
    *(undefined8 *)(local_f0 + lVar6 + 8) = 0;
    *(undefined8 *)(local_f0 + lVar6 + 0x10) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0xf0);
  apbStack_118[3] = (byte *)0x5ea84c;
  apbStack_118[4] = (byte *)szCurrent;
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
  emplace_back<Assimp::SMD::Face>(&this->asTriangles,(Face *)local_f0);
  lVar6 = 0xc0;
  do {
    pvVar3 = *(void **)((long)apbStack_118 + lVar6 + 0x18);
    if (pvVar3 != (void *)0x0) {
      apbStack_118[3] = (byte *)0x5ea869;
      operator_delete(pvVar3,*(long *)(local_f0 + lVar6) - (long)pvVar3);
    }
    lVar6 = lVar6 + -0x40;
  } while (lVar6 != 0);
  pFVar4 = (this->asTriangles).
           super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; (bVar2 = *szCurrent, bVar2 == 0x20 || (bVar2 == 9));
      szCurrent = (char *)((byte *)szCurrent + 1)) {
  }
  apbStack_118[4] = (byte *)szCurrent;
  pbVar7 = (byte *)szCurrent;
  if ((bVar2 < 0xe) && ((0x3401U >> (bVar2 & 0x1f) & 1) != 0)) {
    apbStack_118[3] = (byte *)0x5ea8ab;
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing a triangle");
  }
  else {
    do {
      do {
        pbVar1 = apbStack_118[4] + 1;
        apbStack_118[4] = apbStack_118[4] + 1;
        pbVar7 = pbVar7 + 1;
      } while (0x20 < (ulong)*pbVar1);
    } while ((0x100003601U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0);
    apbStack_118[3] = (byte *)0x5ea8fd;
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,szCurrent,pbVar7);
    apbStack_118[3] = (byte *)0x5ea90a;
    uVar5 = GetTextureIndex(this,(string *)local_f0);
    pFVar4[-1].iTexture = uVar5;
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      apbStack_118[3] = (byte *)0x5ea929;
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    this->iLineNumber = this->iLineNumber + 1;
    while (((ulong)*apbStack_118[4] < 0x21 &&
           ((0x100002600U >> ((ulong)*apbStack_118[4] & 0x3f) & 1) != 0))) {
      apbStack_118[4] = apbStack_118[4] + 1;
    }
    lVar6 = -0xc0;
    do {
      apbStack_118[3] = (byte *)0x5ea975;
      ParseVertex(this,(char *)apbStack_118[4],(char **)(apbStack_118 + 4),
                  (Vertex *)((long)pFVar4->avVertices + lVar6 + -8),false);
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0);
    *szCurrentOut = (char *)apbStack_118[4];
  }
  return;
}

Assistant:

void SMDImporter::ParseTriangle(const char* szCurrent, const char** szCurrentOut) {
    asTriangles.push_back(SMD::Face());
    SMD::Face& face = asTriangles.back();

    if(!SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing a triangle");
        return;
    }

    // read the texture file name
    const char* szLast = szCurrent;
    while (!IsSpaceOrNewLine(*++szCurrent));

    // ... and get the index that belongs to this file name
    face.iTexture = GetTextureIndex(std::string(szLast,(uintptr_t)szCurrent-(uintptr_t)szLast));

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);

    // load three vertices
    for (unsigned int iVert = 0; iVert < 3;++iVert) {
        ParseVertex(szCurrent,&szCurrent, face.avVertices[iVert]);
    }
    *szCurrentOut = szCurrent;
}